

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::train(FastText *this,shared_ptr<fasttext::Args> *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer pcVar3;
  pointer ptVar4;
  Model *pMVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Dictionary *pDVar7;
  char cVar8;
  int iVar9;
  int32_t iVar10;
  ostream *poVar11;
  clock_t cVar12;
  long *plVar13;
  pointer ptVar14;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  ifstream ifs;
  vector<std::thread,_std::allocator<std::thread>_> local_298;
  thread local_278;
  undefined1 local_269;
  Model *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  string local_258;
  Dictionary *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_230 [64];
  
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_238 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Dictionary,std::allocator<fasttext::Dictionary>,std::shared_ptr<fasttext::Args>&>
            (a_Stack_230,&local_238,(allocator<fasttext::Dictionary> *)&local_298,&this->args_);
  _Var6._M_pi = a_Stack_230[0]._M_pi;
  pDVar7 = local_238;
  local_238 = (Dictionary *)0x0;
  a_Stack_230[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pDVar7
  ;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     a_Stack_230[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_230[0]._M_pi);
  }
  iVar9 = std::__cxx11::string::compare
                    ((char *)(this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar9 == 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Cannot use stdin for training!");
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  else {
    std::ifstream::ifstream
              (&local_238,
               (string *)
               (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               _S_in);
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 != '\0') {
      Dictionary::readFromFile
                ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(istream *)&local_238);
      std::ifstream::close();
      if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pretrainedVectors)._M_string_length == 0) {
        iVar10 = Dictionary::nwords((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_268 = (Model *)CONCAT44(local_268._4_4_,iVar10 + peVar2->bucket);
        local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish,(Matrix **)&local_298,
                   (allocator<fasttext::Matrix> *)&local_278,(int *)&local_268,&peVar2->dim);
        ptVar4 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar14 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)ptVar14;
        (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar4;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_finish);
        }
        Matrix::uniform((this->input_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        1.0 / (float)((this->args_).
                                      super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->dim);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"loading pre-trained subwords from: ",0x23);
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(peVar2->pretrainedVectors)._M_dataplus._M_p,
                             (peVar2->pretrainedVectors)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        pcVar3 = (peVar2->pretrainedVectors)._M_dataplus._M_p;
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,pcVar3,pcVar3 + (peVar2->pretrainedVectors)._M_string_length
                  );
        loadVectors(this,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        iVar10 = Dictionary::nlabels((this->dict_).
                                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        local_268 = (Model *)CONCAT44(local_268._4_4_,iVar10);
        local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish,(Matrix **)&local_298,
                   (allocator<fasttext::Matrix> *)&local_278,(int *)&local_268,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->dim);
      }
      else {
        iVar10 = Dictionary::nwords((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        local_268 = (Model *)CONCAT44(local_268._4_4_,iVar10);
        local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish,(Matrix **)&local_298,
                   (allocator<fasttext::Matrix> *)&local_278,(int *)&local_268,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->dim);
      }
      ptVar4 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar14 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)ptVar14;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar4;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      cVar12 = clock();
      this->start = cVar12;
      LOCK();
      (this->tokenCount).super___atomic_base<long>._M_i = 0;
      UNLOCK();
      local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Created threads: ",0x11);
      iVar10 = Dictionary::nwords((this->dict_).
                                  super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
      std::ostream::put((char)plVar13);
      std::ostream::flush();
      ptVar14 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->thread) {
        iVar9 = 0;
        do {
          local_278._M_id._M_thread = (id)0;
          local_268 = (Model *)operator_new(0x18);
          (local_268->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&PTR___State_00126d08;
          (local_268->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          *(int *)&(local_268->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr = iVar9;
          std::thread::_M_start_thread(&local_278,&local_268,0);
          if (local_268 != (Model *)0x0) {
            (*(code *)((local_268->wi_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_)
                      ();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                    (&local_298,&local_278);
          if (local_278._M_id._M_thread != 0) {
            std::terminate();
          }
          iVar9 = iVar9 + 1;
          ptVar14 = local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (iVar9 < ((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         thread);
      }
      for (; ptVar14 !=
             local_298.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish; ptVar14 = ptVar14 + 1) {
        std::thread::join();
      }
      local_278._M_id._M_thread = (id)((ulong)local_278._M_id._M_thread & 0xffffffff00000000);
      local_268 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
                (&_Stack_260,&local_268,(allocator<fasttext::Model> *)&local_269,&this->input_,
                 &this->output_,&this->args_,(int *)&local_278);
      _Var6._M_pi = _Stack_260._M_pi;
      pMVar5 = local_268;
      local_268 = (Model *)0x0;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar5
      ;
      (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var6._M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         _Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_260._M_pi);
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model != sup) {
        saveVectors(this);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_298);
      std::ifstream::~ifstream(&local_238);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Input file cannot be opened!",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(1);
}

Assistant:

void FastText::train(std::shared_ptr<Args> args) {
  args_ = args;
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    std::cerr << "Cannot use stdin for training!" << std::endl;
    exit(EXIT_FAILURE);
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    std::cerr << "Input file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (args_->pretrainedVectors.size() != 0) {
    std::cout << "loading pre-trained subwords from: " << args_->pretrainedVectors << std::endl;
    loadVectors(args_->pretrainedVectors);
  } else {
    input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
    input_->uniform(1.0 / args_->dim);
  }

  if (args_->model == model_name::sup) {
    output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
  } else {
    output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
  }
  output_->zero();

//  reduceCorpus(0);
//  exit(-1);

  start = clock();
  tokenCount = 0;
  std::vector<std::thread> threads;
  std::cout <<  "Created threads: " << dict_->nwords() << std::endl;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  for (auto it = threads.begin(); it != threads.end(); ++it) {
    it->join();
  }
  model_ = std::make_shared<Model>(input_, output_, args_, 0);

  //saveModel();
  if (args_->model != model_name::sup) {
    saveVectors();
  }
}